

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoSwitches.hpp
# Opt level: O0

void __thiscall
Apple::II::VideoSwitches<Cycles>::set_annunciator_3(VideoSwitches<Cycles> *this,bool annunciator_3)

{
  anon_class_16_2_f65f7197 local_50;
  function<void_()> local_40;
  Cycles local_20;
  undefined1 local_11;
  VideoSwitches<Cycles> *pVStack_10;
  bool annunciator_3_local;
  VideoSwitches<Cycles> *this_local;
  
  (this->external_).annunciator_3 = annunciator_3;
  local_20.super_WrappedInt<Cycles>.length_ =
       (WrappedInt<Cycles>)(this->delay_).super_WrappedInt<Cycles>.length_;
  local_50.this = this;
  local_50.annunciator_3 = annunciator_3;
  local_11 = annunciator_3;
  pVStack_10 = this;
  std::function<void()>::
  function<Apple::II::VideoSwitches<Cycles>::set_annunciator_3(bool)::_lambda()_1_,void>
            ((function<void()> *)&local_40,&local_50);
  DeferredQueue<Cycles>::defer(&(this->deferrer_).super_DeferredQueue<Cycles>,local_20,&local_40);
  std::function<void_()>::~function(&local_40);
  return;
}

Assistant:

void set_annunciator_3(bool annunciator_3) {
			external_.annunciator_3 = annunciator_3;
			deferrer_.defer(delay_, [this, annunciator_3] {
				internal_.annunciator_3 = annunciator_3;
				high_resolution_mask_ = annunciator_3 ? 0x7f : 0xff;
			});
		}